

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O3

Status __thiscall leveldb::anon_unknown_3::DBIter::status(DBIter *this)

{
  _func_int **pp_Var1;
  long in_RSI;
  long in_FS_OFFSET;
  
  if (*(char **)(in_RSI + 0x48) == (char *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) goto LAB_00664bce;
    (**(code **)(**(long **)(in_RSI + 0x38) + 0x50))(this);
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
LAB_00664bce:
      __stack_chk_fail();
    }
    pp_Var1 = (_func_int **)Status::CopyState(*(char **)(in_RSI + 0x48));
    (this->super_Iterator)._vptr_Iterator = pp_Var1;
  }
  return (Status)(char *)this;
}

Assistant:

Status status() const override {
    if (status_.ok()) {
      return iter_->status();
    } else {
      return status_;
    }
  }